

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BPlusTree.h
# Opt level: O3

void __thiscall BPlusTree<int>::BPlusTree(BPlusTree<int> *this,bool dupes_allowed)

{
  int *piVar1;
  BPlusTree<int> **ppBVar2;
  
  this->data_size = 0;
  this->subset_size = 0;
  (this->data).data = (int *)0x0;
  (this->data).capacity = 3;
  piVar1 = (int *)operator_new__(0xc);
  piVar1[0] = 0;
  piVar1[1] = 0;
  piVar1[2] = 0;
  (this->data).data = piVar1;
  (this->subset).data = (BPlusTree<int> **)0x0;
  (this->subset).capacity = 4;
  ppBVar2 = (BPlusTree<int> **)operator_new__(0x20);
  ppBVar2[2] = (BPlusTree<int> *)0x0;
  ppBVar2[3] = (BPlusTree<int> *)0x0;
  *ppBVar2 = (BPlusTree<int> *)0x0;
  ppBVar2[1] = (BPlusTree<int> *)0x0;
  (this->subset).data = ppBVar2;
  this->duplicates_allowed = dupes_allowed;
  this->next = (BPlusTree<int> *)0x0;
  return;
}

Assistant:

BPlusTree<T>::BPlusTree(bool dupes_allowed) : duplicates_allowed(dupes_allowed) {}